

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O1

int nghttp2_submit_priority_update
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *field_value,
              size_t field_value_len)

{
  nghttp2_mem *mem;
  int iVar1;
  uint8_t *dest;
  uint8_t *puVar2;
  nghttp2_outbound_item *item;
  
  if (session->server != '\0') {
    return -0x207;
  }
  if ((session->remote_settings).no_rfc7540_priorities == 0) {
LAB_0016a681:
    iVar1 = 0;
  }
  else {
    if (field_value_len - 0x3ffd < 0xffffffffffffbfff || stream_id == 0) {
      return -0x1f5;
    }
    mem = &session->mem;
    if (field_value_len == 0) {
      dest = (uint8_t *)0x0;
LAB_0016a61a:
      item = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem,0x98);
      if (item != (nghttp2_outbound_item *)0x0) {
        nghttp2_outbound_item_init(item);
        (item->aux_data).goaway.flags = '\x01';
        (item->frame).ext.payload = &item->ext_frame_payload;
        nghttp2_frame_priority_update_init((nghttp2_extension *)item,stream_id,dest,field_value_len)
        ;
        iVar1 = nghttp2_session_add_item(session,item);
        if (iVar1 != 0) {
          nghttp2_frame_priority_update_free((nghttp2_extension *)item,mem);
          nghttp2_mem_free(mem,item);
          return iVar1;
        }
        goto LAB_0016a681;
      }
      free(dest);
    }
    else {
      dest = (uint8_t *)nghttp2_mem_malloc(mem,field_value_len + 1);
      if (dest != (uint8_t *)0x0) {
        puVar2 = nghttp2_cpymem(dest,field_value,field_value_len);
        *puVar2 = '\0';
        goto LAB_0016a61a;
      }
    }
    iVar1 = -0x385;
  }
  return iVar1;
}

Assistant:

int nghttp2_submit_priority_update(nghttp2_session *session, uint8_t flags,
                                   int32_t stream_id,
                                   const uint8_t *field_value,
                                   size_t field_value_len) {
  nghttp2_mem *mem;
  uint8_t *buf, *p;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_ext_priority_update *priority_update;
  int rv;
  (void)flags;

  mem = &session->mem;

  if (session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (session->remote_settings.no_rfc7540_priorities == 0) {
    return 0;
  }

  if (stream_id == 0 || 4 + field_value_len > NGHTTP2_MAX_PAYLOADLEN) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (field_value_len) {
    buf = nghttp2_mem_malloc(mem, field_value_len + 1);
    if (buf == NULL) {
      return NGHTTP2_ERR_NOMEM;
    }

    p = nghttp2_cpymem(buf, field_value, field_value_len);
    *p = '\0';
  } else {
    buf = NULL;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail_item_malloc;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.ext.builtin = 1;

  priority_update = &item->ext_frame_payload.priority_update;

  frame = &item->frame;
  frame->ext.payload = priority_update;

  nghttp2_frame_priority_update_init(&frame->ext, stream_id, buf,
                                     field_value_len);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_priority_update_free(&frame->ext, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;

fail_item_malloc:
  free(buf);

  return rv;
}